

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR cast_string_elem(lyd_node *node,lyxp_set *set,char **str)

{
  LY_ERR LVar1;
  char *pcVar2;
  LY_ERR local_30;
  LY_ERR rc;
  uint32_t size;
  uint32_t used;
  char **str_local;
  lyxp_set *set_local;
  lyd_node *node_local;
  
  _size = str;
  str_local = (char **)set;
  set_local = (lyxp_set *)node;
  pcVar2 = (char *)malloc(0x40);
  *_size = pcVar2;
  if (*_size == (char *)0x0) {
    ly_log((ly_ctx *)str_local[8],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "cast_string_elem");
    node_local._4_4_ = LY_EMEM;
  }
  else {
    **_size = '\0';
    rc = LY_EMEM;
    local_30 = 0x40;
    LVar1 = cast_string_recursive((lyd_node *)set_local,(lyxp_set *)str_local,0,_size,&rc,&local_30)
    ;
    if (LVar1 == LY_SUCCESS) {
      if (rc < local_30) {
        pcVar2 = (char *)ly_realloc(*_size,(ulong)rc);
        *_size = pcVar2;
        if (*_size == (char *)0x0) {
          ly_log((ly_ctx *)str_local[8],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "cast_string_elem");
          return LY_EMEM;
        }
      }
      node_local._4_4_ = LY_SUCCESS;
    }
    else {
      free(*_size);
      node_local._4_4_ = LVar1;
    }
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
cast_string_elem(const struct lyd_node *node, struct lyxp_set *set, char **str)
{
    uint32_t used, size;
    LY_ERR rc;

    *str = malloc(LYXP_STRING_CAST_SIZE_START * sizeof(char));
    LY_CHECK_ERR_RET(!*str, LOGMEM(set->ctx), LY_EMEM);
    (*str)[0] = '\0';
    used = 1;
    size = LYXP_STRING_CAST_SIZE_START;

    rc = cast_string_recursive(node, set, 0, str, &used, &size);
    if (rc != LY_SUCCESS) {
        free(*str);
        return rc;
    }

    if (size > used) {
        *str = ly_realloc(*str, used * sizeof(char));
        LY_CHECK_ERR_RET(!*str, LOGMEM(set->ctx), LY_EMEM);
    }
    return LY_SUCCESS;
}